

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalNext(Fts3Cursor *pCsr)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  Fts3Expr *pExpr;
  int rc;
  int *in_stack_00000070;
  Fts3Expr *in_stack_00000078;
  Fts3Cursor *in_stack_00000080;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  lVar2 = *(long *)(in_RDI + 6);
  if (lVar2 == 0) {
    *(undefined1 *)((long)in_RDI + 10) = 1;
  }
  else {
    do {
      if (*(char *)((long)in_RDI + 0xb) == '\0') {
        sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar5,in_stack_fffffffffffffff0));
      }
      fts3EvalNextRow(in_stack_00000080,in_stack_00000078,in_stack_00000070);
      *(undefined1 *)((long)in_RDI + 10) = *(undefined1 *)(lVar2 + 0x30);
      *(undefined1 *)((long)in_RDI + 0xb) = 1;
      in_RDI[0x1c] = 1;
      *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(lVar2 + 0x28);
      bVar4 = false;
      if (*(char *)((long)in_RDI + 10) == '\0') {
        iVar3 = sqlite3Fts3EvalTestDeferred
                          ((Fts3Cursor *)CONCAT44(iVar5,in_stack_fffffffffffffff0),in_RDI);
        bVar4 = iVar3 != 0;
      }
    } while (bVar4);
  }
  if ((iVar5 == 0) &&
     ((((char)in_RDI[0x13] == '\0' && (*(long *)(in_RDI + 0x1a) < *(long *)(in_RDI + 0xc))) ||
      (((char)in_RDI[0x13] != '\0' && (*(long *)(in_RDI + 0xc) < *(long *)(in_RDI + 0x18))))))) {
    *(undefined1 *)((long)in_RDI + 10) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int fts3EvalNext(Fts3Cursor *pCsr){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Expr *pExpr = pCsr->pExpr;
  assert( pCsr->isEof==0 );
  if( pExpr==0 ){
    pCsr->isEof = 1;
  }else{
    do {
      if( pCsr->isRequireSeek==0 ){
        sqlite3_reset(pCsr->pStmt);
      }
      assert( sqlite3_data_count(pCsr->pStmt)==0 );
      fts3EvalNextRow(pCsr, pExpr, &rc);
      pCsr->isEof = pExpr->bEof;
      pCsr->isRequireSeek = 1;
      pCsr->isMatchinfoNeeded = 1;
      pCsr->iPrevId = pExpr->iDocid;
    }while( pCsr->isEof==0 && sqlite3Fts3EvalTestDeferred(pCsr, &rc) );
  }

  /* Check if the cursor is past the end of the docid range specified
  ** by Fts3Cursor.iMinDocid/iMaxDocid. If so, set the EOF flag.  */
  if( rc==SQLITE_OK && (
        (pCsr->bDesc==0 && pCsr->iPrevId>pCsr->iMaxDocid)
     || (pCsr->bDesc!=0 && pCsr->iPrevId<pCsr->iMinDocid)
  )){
    pCsr->isEof = 1;
  }

  return rc;
}